

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async_log_helper.h
# Opt level: O1

void __thiscall spdlog::details::async_log_helper::~async_log_helper(async_log_helper *this)

{
  _Manager_type p_Var1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  async_msg local_78;
  
  local_78.logger_name._M_dataplus._M_p = (pointer)&local_78.logger_name.field_2;
  local_78.logger_name._M_string_length = 0;
  local_78.logger_name.field_2._M_local_buf[0] = '\0';
  local_78.level = info;
  local_78.txt._M_dataplus._M_p = (pointer)&local_78.txt.field_2;
  local_78.time.__d.__r = (duration)0;
  local_78.thread_id = 0;
  local_78.txt._M_string_length = 0;
  local_78.txt.field_2._M_local_buf[0] = '\0';
  local_78.msg_type = terminate;
  local_78.msg_id = 0;
  push_msg(this,&local_78);
  async_msg::~async_msg(&local_78);
  std::thread::join();
  if ((this->_worker_thread)._M_id._M_thread == 0) {
    p_Var1 = (this->_worker_teardown_cb).super__Function_base._M_manager;
    if (p_Var1 != (_Manager_type)0x0) {
      (*p_Var1)((_Any_data *)&this->_worker_teardown_cb,(_Any_data *)&this->_worker_teardown_cb,
                __destroy_functor);
    }
    p_Var1 = (this->_worker_warmup_cb).super__Function_base._M_manager;
    if (p_Var1 != (_Manager_type)0x0) {
      (*p_Var1)((_Any_data *)&this->_worker_warmup_cb,(_Any_data *)&this->_worker_warmup_cb,
                __destroy_functor);
    }
    p_Var1 = (this->_err_handler).super__Function_base._M_manager;
    if (p_Var1 != (_Manager_type)0x0) {
      (*p_Var1)((_Any_data *)&this->_err_handler,(_Any_data *)&this->_err_handler,__destroy_functor)
      ;
    }
    mpmc_bounded_queue<spdlog::details::async_log_helper::async_msg>::~mpmc_bounded_queue(&this->_q)
    ;
    std::
    vector<std::shared_ptr<spdlog::sinks::sink>,_std::allocator<std::shared_ptr<spdlog::sinks::sink>_>_>
    ::~vector(&this->_sinks);
    this_00 = (this->_formatter).super___shared_ptr<spdlog::formatter,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi;
    if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
    }
    return;
  }
  std::terminate();
}

Assistant:

inline spdlog::details::async_log_helper::~async_log_helper()
{
    try
    {
        push_msg(async_msg(async_msg_type::terminate));
        _worker_thread.join();
    }
    catch (...) // don't crash in destructor
    {
    }
}